

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

SingleCallStatistics *
deqp::gles3::Performance::anon_unknown_1::calculateSampleStatistics
          (SingleCallStatistics *__return_storage_ptr__,LineParametersWithConfidence *fit,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
          *samples)

{
  pointer pUVar1;
  ulong uVar2;
  long lVar3;
  pointer pfVar4;
  pointer puVar5;
  deUint64 *pdVar6;
  int *piVar7;
  SingleCallStatistics *extraout_RAX;
  uint uVar8;
  size_type __n;
  ulong uVar9;
  pointer pfVar10;
  pointer puVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  allocator_type local_91;
  vector<float,_std::allocator<float>_> local_90;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_60,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_90);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 5;
  uVar8 = (uint)__n;
  if (0 < (int)uVar8) {
    pdVar6 = &(pUVar1->duration).fitResponseDuration;
    uVar9 = 0;
    do {
      local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] = *pdVar6;
      uVar9 = uVar9 + 1;
      pdVar6 = pdVar6 + 4;
    } while ((uVar8 & 0x7fffffff) != uVar9);
  }
  std::vector<float,_std::allocator<float>_>::vector(&local_90,__n,&local_91);
  pfVar4 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar10 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (uint)((ulong)((long)(samples->
                               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 5);
  if (0 < (int)uVar8) {
    piVar7 = &pUVar1->writtenSize;
    uVar9 = 0;
    do {
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] =
           (float)*piVar7 /
           (((float)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar9] / 1000.0) / 1000.0);
      uVar9 = uVar9 + 1;
      piVar7 = piVar7 + 8;
    } while ((uVar8 & 0x7fffffff) != uVar9);
  }
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar9 = (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar10,pfVar4);
    pfVar10 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  pfVar4 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78._0_4_ =
       (float)(((long)pfVar10 -
                (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) - 1) * 0.5;
  fVar12 = floorf((float)local_78._0_4_);
  __return_storage_ptr__->medianRate =
       (1.0 - ((float)local_78._0_4_ - (float)(int)fVar12)) * pfVar4[(int)fVar12] +
       ((float)local_78._0_4_ - (float)(int)fVar12) * pfVar4[(int)fVar12 + 1];
  operator_delete(pfVar4,(long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage - (long)pfVar4);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_90,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_91);
  pfVar4 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar10 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (uint)((ulong)((long)(samples->
                               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 5);
  if (0 < (int)uVar8) {
    piVar7 = &pUVar1->writtenSize;
    uVar9 = 0;
    do {
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] =
           (float)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar9] -
           ((float)*piVar7 * fit->coefficient + fit->offset);
      uVar9 = uVar9 + 1;
      piVar7 = piVar7 + 8;
    } while ((uVar8 & 0x7fffffff) != uVar9);
  }
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar9 = (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar10,pfVar4);
  }
  pfVar10 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  __return_storage_ptr__->maxDiffTime =
       local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish[-1];
  fVar12 = (float)(((long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 1);
  local_78._4_4_ = fVar12 * 0.5;
  local_78._0_4_ = fVar12 * 0.9;
  fStack_70 = fVar12 * 0.0;
  fStack_6c = fVar12 * 0.0;
  local_48 = floorf(fVar12 * 0.9);
  fVar12 = floorf((float)local_78._4_4_);
  iVar13 = (int)local_48;
  iVar14 = (int)fVar12;
  fVar12 = pfVar10[iVar14 + 1];
  fVar15 = pfVar10[iVar14];
  __return_storage_ptr__->maxDiff9DecileTime =
       pfVar10[iVar13] * (1.0 - ((float)local_78._0_4_ - (float)iVar13)) +
       pfVar10[iVar13 + 1] * ((float)local_78._0_4_ - (float)iVar13);
  __return_storage_ptr__->medianDiffTime =
       fVar15 * (1.0 - ((float)local_78._4_4_ - (float)iVar14)) +
       fVar12 * ((float)local_78._4_4_ - (float)iVar14);
  operator_delete(pfVar10,(long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage - (long)pfVar10);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_90,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_91);
  pfVar4 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar10 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (uint)((ulong)((long)(samples->
                               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 5);
  if (0 < (int)uVar8) {
    piVar7 = &pUVar1->writtenSize;
    uVar9 = 0;
    do {
      fVar12 = (float)*piVar7 * fit->coefficient + fit->offset;
      fVar15 = 0.0;
      if (1.0 <= fVar12) {
        fVar15 = ((float)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar9] - fVar12) / fVar12;
      }
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = fVar15;
      uVar9 = uVar9 + 1;
      piVar7 = piVar7 + 8;
    } while ((uVar8 & 0x7fffffff) != uVar9);
  }
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar9 = (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar10,pfVar4);
  }
  __return_storage_ptr__->maxRelDiffTime =
       local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish[-1];
  fVar12 = (float)(((long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 1);
  local_78._4_4_ = fVar12 * 0.5;
  local_78._0_4_ = fVar12 * 0.9;
  fStack_70 = fVar12 * 0.0;
  fStack_6c = fVar12 * 0.0;
  local_48 = floorf(fVar12 * 0.9);
  fVar12 = floorf((float)local_78._4_4_);
  iVar13 = (int)local_48;
  iVar14 = (int)fVar12;
  fVar12 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[iVar14 + 1];
  fVar15 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[iVar14];
  __return_storage_ptr__->max9DecileRelDiffTime =
       local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar13] * (1.0 - ((float)local_78._0_4_ - (float)iVar13)) +
       local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar13 + 1] * ((float)local_78._0_4_ - (float)iVar13);
  __return_storage_ptr__->medianRelDiffTime =
       fVar15 * (1.0 - ((float)local_78._4_4_ - (float)iVar14)) +
       fVar12 * ((float)local_78._4_4_ - (float)iVar14);
  operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
  puVar5 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar11 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar9 = (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar11,puVar5);
    puVar11 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  (__return_storage_ptr__->result).minTime = (float)*puVar11;
  (__return_storage_ptr__->result).maxTime =
       (float)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
  fStack_3c = (float)(((long)local_60.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 3) - 1);
  _local_78 = ZEXT416((uint)fStack_3c);
  local_48 = fStack_3c * 0.5;
  fStack_44 = fStack_3c * 0.1;
  fStack_40 = fStack_3c * 0.0;
  fStack_3c = fStack_3c * 0.0;
  local_38 = floorf(local_48);
  fVar12 = floorf(fStack_44);
  iVar13 = (int)local_38;
  iVar14 = (int)fVar12;
  uVar9 = puVar11[iVar14];
  uVar2 = puVar11[iVar14 + 1];
  (__return_storage_ptr__->result).medianTime =
       (float)puVar11[iVar13 + 1] * (local_48 - (float)iVar13) +
       (float)puVar11[iVar13] * (1.0 - (local_48 - (float)iVar13));
  (__return_storage_ptr__->result).min2DecileTime =
       (float)uVar2 * (fStack_44 - (float)iVar14) +
       (float)uVar9 * (1.0 - (fStack_44 - (float)iVar14));
  local_78._0_4_ = (float)local_78._0_4_ * 0.9;
  fVar12 = floorf((float)local_78._0_4_);
  (__return_storage_ptr__->result).max9DecileTime =
       (float)puVar11[(int)fVar12 + 1] * ((float)local_78._0_4_ - (float)(int)fVar12) +
       (float)puVar11[(int)fVar12] * (1.0 - ((float)local_78._0_4_ - (float)(int)fVar12));
  operator_delete(puVar11,(long)local_60.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar11);
  return extraout_RAX;
}

Assistant:

static SingleCallStatistics calculateSampleStatistics (const LineParametersWithConfidence& fit, const std::vector<UploadSampleResult<SingleOperationDuration> >& samples)
{
	SingleCallStatistics stats;

	calculateBasicTransferStatistics(stats, fit, samples);

	return stats;
}